

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::SENode::AsString_abi_cxx11_(string *__return_storage_ptr__,SENode *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = (**this->_vptr_SENode)(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(iVar1) {
  case 0:
    pcVar3 = "Constant";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "RecurrentAddExpr";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "Add";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "Multiply";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "Negative";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "Value Unknown";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "Can not compute";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "NULL";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SENode::AsString() const {
  switch (GetType()) {
    case Constant:
      return "Constant";
    case RecurrentAddExpr:
      return "RecurrentAddExpr";
    case Add:
      return "Add";
    case Negative:
      return "Negative";
    case Multiply:
      return "Multiply";
    case ValueUnknown:
      return "Value Unknown";
    case CanNotCompute:
      return "Can not compute";
  }
  return "NULL";
}